

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyChordPressed(ImGuiKeyChord key_chord,ImGuiInputFlags flags,ImGuiID owner_id)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiKey IVar3;
  ImGuiKey key;
  ImGuiKey mods;
  ImGuiContext *g;
  bool local_1;
  
  pIVar1 = GImGui;
  IVar3 = FixupKeyChord(0);
  if ((pIVar1->IO).KeyMods == (IVar3 & ImGuiMod_Mask_)) {
    if ((IVar3 & ~ImGuiMod_Mask_) == ImGuiKey_KeysData_OFFSET) {
      ConvertSingleModFlagToKey(IVar3 & ImGuiMod_Mask_);
    }
    bVar2 = IsKeyPressed((ImGuiKey)g,mods,key);
    if (bVar2) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::IsKeyChordPressed(ImGuiKeyChord key_chord, ImGuiInputFlags flags, ImGuiID owner_id)
{
    ImGuiContext& g = *GImGui;
    key_chord = FixupKeyChord(key_chord);
    ImGuiKey mods = (ImGuiKey)(key_chord & ImGuiMod_Mask_);
    if (g.IO.KeyMods != mods)
        return false;

    // Special storage location for mods
    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    if (key == ImGuiKey_None)
        key = ConvertSingleModFlagToKey(mods);
    if (!IsKeyPressed(key, (flags & ImGuiInputFlags_RepeatMask_), owner_id))
        return false;
    return true;
}